

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_protocol.cc
# Opt level: O0

void __thiscall helix::nasdaq::itch50_protocol::itch50_protocol(itch50_protocol *this,string *name)

{
  string *in_RSI;
  protocol *in_RDI;
  
  protocol::protocol(in_RDI);
  in_RDI->_vptr_protocol = (_func_int **)&PTR__itch50_protocol_0015da40;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  return;
}

Assistant:

itch50_protocol::itch50_protocol(std::string name)
    :_name{std::move(name)}
{
}